

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O0

DdNode * Aig_ManInitStateVarMap(DdManager *dd,Aig_Man_t *p,int fVerbose)

{
  Vec_Ptr_t *p_00;
  DdNode **ppDVar1;
  int iVar2;
  DdNode **x;
  DdNode **y;
  Aig_Obj_t *n;
  int local_4c;
  int i;
  Aig_Obj_t *pLatch;
  DdNode *bProd;
  DdNode *bTemp;
  DdNode **pbVarsY;
  DdNode **pbVarsX;
  int fVerbose_local;
  Aig_Man_t *p_local;
  DdManager *dd_local;
  
  x = (DdNode **)malloc((long)dd->size << 3);
  y = (DdNode **)malloc((long)dd->size << 3);
  pLatch = (Aig_Obj_t *)dd->one;
  Cudd_Ref((DdNode *)pLatch);
  for (local_4c = 0; iVar2 = Saig_ManRegNum(p), local_4c < iVar2; local_4c = local_4c + 1) {
    p_00 = p->vCis;
    iVar2 = Saig_ManPiNum(p);
    Vec_PtrEntry(p_00,local_4c + iVar2);
    ppDVar1 = dd->vars;
    iVar2 = Saig_ManPiNum(p);
    x[local_4c] = ppDVar1[iVar2 + local_4c];
    ppDVar1 = dd->vars;
    iVar2 = Saig_ManCiNum(p);
    y[local_4c] = ppDVar1[iVar2 + local_4c];
    n = (Aig_Obj_t *)Cudd_bddAnd(dd,(DdNode *)pLatch,(DdNode *)((ulong)x[local_4c] ^ 1));
    Cudd_Ref((DdNode *)n);
    Cudd_RecursiveDeref(dd,(DdNode *)pLatch);
    pLatch = n;
  }
  iVar2 = Saig_ManRegNum(p);
  Cudd_SetVarMap(dd,x,y,iVar2);
  if (x != (DdNode **)0x0) {
    free(x);
  }
  if (y != (DdNode **)0x0) {
    free(y);
  }
  Cudd_Deref((DdNode *)pLatch);
  return (DdNode *)pLatch;
}

Assistant:

DdNode * Aig_ManInitStateVarMap( DdManager * dd, Aig_Man_t * p, int fVerbose )
{
    DdNode ** pbVarsX, ** pbVarsY;
    DdNode * bTemp, * bProd;
    Aig_Obj_t * pLatch;
    int i;

    // set the variable mapping for Cudd_bddVarMap()
    pbVarsX = ABC_ALLOC( DdNode *, dd->size );
    pbVarsY = ABC_ALLOC( DdNode *, dd->size );
    bProd = (dd)->one;         Cudd_Ref( bProd );
    Saig_ManForEachLo( p, pLatch, i )
    {
        pbVarsX[i] = dd->vars[ Saig_ManPiNum(p) + i ];
        pbVarsY[i] = dd->vars[ Saig_ManCiNum(p) + i ];
        // get the initial value of the latch
        bProd = Cudd_bddAnd( dd, bTemp = bProd, Cudd_Not(pbVarsX[i]) );      Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bTemp ); 
    }
    Cudd_SetVarMap( dd, pbVarsX, pbVarsY, Saig_ManRegNum(p) );
    ABC_FREE( pbVarsX );
    ABC_FREE( pbVarsY );

    Cudd_Deref( bProd );
    return bProd;
}